

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O3

void __thiscall pbrt::ParsedScene::ConcatTransform(ParsedScene *this,Float *tr,FileLoc loc)

{
  Float (*paFVar1) [4];
  ulong uVar2;
  bool bVar3;
  Transform *this_00;
  undefined1 (*pauVar4) [16];
  Transform *pTVar5;
  int i;
  long lVar6;
  bool bVar7;
  int i_00;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [16];
  SquareMatrix<4> r_1;
  Transform local_2f8;
  undefined1 local_278 [32];
  undefined1 local_258 [32];
  Float local_238 [2];
  Float aFStack_230 [2];
  Float aFStack_228 [2];
  Float aFStack_220 [2];
  Float aFStack_218 [2];
  Float aFStack_210 [2];
  Float aFStack_208 [2];
  Float aFStack_200 [2];
  undefined1 local_1f8 [64];
  undefined1 local_1b8 [64];
  SquareMatrix<4> local_178;
  Transform local_138;
  Transform local_b0;
  
  if (this->currentApiState == Uninitialized) {
    paFVar1 = local_2f8.m.m + 1;
    local_2f8.m.m[0][2] = 0.0;
    local_2f8.m.m[0][3] = 0.0;
    local_2f8.m.m[1][0]._0_1_ = 0;
    local_2f8.m.m[0]._0_8_ = paFVar1;
    detail::stringPrintfRecursive<char_const(&)[16]>
              ((string *)&local_2f8,"pbrtInit() must be before calling \"%s()\". Ignoring.",
               (char (*) [16])"ConcatTransform");
    Error(&loc,(char *)local_2f8.m.m[0]._0_8_);
    if ((Float (*) [4])local_2f8.m.m[0]._0_8_ != paFVar1) {
      operator_delete((void *)local_2f8.m.m[0]._0_8_,
                      CONCAT71(local_2f8.m.m[1]._1_7_,local_2f8.m.m[1][0]._0_1_) + 1);
    }
  }
  else {
    auVar10 = vpmovsxbq_avx2(ZEXT416(0x30201000));
    i_00 = 0;
    auVar11 = vpbroadcastq_avx512f();
    auVar12 = vpaddq_avx512f(auVar11,_DAT_004fc2c0);
    auVar11 = vpaddq_avx512f(auVar11,_DAT_004fc300);
    local_1f8 = vmovdqu64_avx512f(auVar11);
    auVar8 = vpbroadcastq_avx512vl();
    local_1b8 = vmovdqu64_avx512f(auVar12);
    local_258 = vpaddq_avx2(auVar8,auVar10);
    auVar8 = vpbroadcastq_avx512vl();
    local_278 = vpaddq_avx2(auVar8,auVar10);
    bVar3 = true;
    do {
      bVar7 = bVar3;
      if ((this->activeTransformBits >> i_00 & 1) != 0) {
        this_00 = TransformSet::operator[](&this->curTransform,i_00);
        vscatterqps_avx512f(ZEXT864(0) + local_1f8,0xffff,*(undefined1 (*) [32])tr);
        vscatterqps_avx512f(ZEXT864(0) + local_1b8,0xffff,*(undefined1 (*) [32])(tr + 8));
        pbrt::Transform::Transform(&local_b0,&local_178);
        auVar10 = vpmovsxbq_avx2(ZEXT416(0x3020100));
        lVar6 = 0;
        pTVar5 = &local_2f8;
        do {
          auVar8 = vpbroadcastq_avx512vl();
          lVar6 = lVar6 + 1;
          uVar2 = vpcmpeqq_avx512vl(auVar8,auVar10);
          auVar13 = vpmovm2d_avx512vl(uVar2 & 0xf);
          auVar13 = vpsrld_avx(auVar13,0x1f);
          auVar13 = vcvtdq2ps_avx(auVar13);
          *(undefined1 (*) [16])pTVar5 = auVar13;
          auVar8 = local_258;
          pTVar5 = (Transform *)((long)pTVar5 + 0x10);
        } while (lVar6 != 4);
        lVar6 = 0;
        pTVar5 = &local_2f8;
        do {
          auVar9 = vpbroadcastq_avx512vl();
          lVar6 = lVar6 + 1;
          auVar9 = vpsllq_avx2(auVar9,2);
          vpaddq_avx2(auVar8,auVar9);
          auVar13 = vgatherqps_avx512vl(*(undefined8 *)*(undefined1 (*) [16])pTVar5);
          *(undefined1 (*) [16])pTVar5 = auVar13;
          pTVar5 = (Transform *)((long)pTVar5 + 0x10);
        } while (lVar6 != 4);
        pauVar4 = (undefined1 (*) [16])local_238;
        lVar6 = 0;
        do {
          auVar8 = vpbroadcastq_avx512vl();
          lVar6 = lVar6 + 1;
          uVar2 = vpcmpeqq_avx512vl(auVar8,auVar10);
          auVar13 = vpmovm2d_avx512vl(uVar2 & 0xf);
          auVar13 = vpsrld_avx(auVar13,0x1f);
          auVar13 = vcvtdq2ps_avx(auVar13);
          *pauVar4 = auVar13;
          pauVar4 = pauVar4 + 1;
        } while (lVar6 != 4);
        pauVar4 = (undefined1 (*) [16])local_238;
        lVar6 = 0;
        do {
          auVar10 = vpbroadcastq_avx512vl();
          lVar6 = lVar6 + 1;
          auVar10 = vpsllq_avx2(auVar10,2);
          vpaddq_avx2(local_278,auVar10);
          auVar13 = vgatherqps_avx512vl(*(undefined8 *)*pauVar4);
          *pauVar4 = auVar13;
          pauVar4 = pauVar4 + 1;
        } while (lVar6 != 4);
        local_138.m.m[0][0] = local_2f8.m.m[0][0];
        local_138.m.m[0][1] = local_2f8.m.m[0][1];
        local_138.m.m[0][2] = local_2f8.m.m[0][2];
        local_138.m.m[0][3] = local_2f8.m.m[0][3];
        local_138.m.m[1][2] = local_2f8.m.m[1][2];
        local_138.m.m[1][3] = local_2f8.m.m[1][3];
        local_138.m.m[2][0] = local_2f8.m.m[2][0];
        local_138.m.m[2][1] = local_2f8.m.m[2][1];
        local_138.m.m[2][2] = local_2f8.m.m[2][2];
        local_138.m.m[2][3] = local_2f8.m.m[2][3];
        local_138.m.m[3][0] = local_2f8.m.m[3][0];
        local_138.m.m[3][1] = local_2f8.m.m[3][1];
        local_138.m.m[3][2] = local_2f8.m.m[3][2];
        local_138.m.m[3][3] = local_2f8.m.m[3][3];
        local_138.mInv.m[0][0] = local_238[0];
        local_138.mInv.m[0][1] = local_238[1];
        local_138.mInv.m[0][2] = aFStack_230[0];
        local_138.mInv.m[0][3] = aFStack_230[1];
        local_138.mInv.m[1][0] = aFStack_228[0];
        local_138.mInv.m[1][1] = aFStack_228[1];
        local_138.mInv.m[1][2] = aFStack_220[0];
        local_138.mInv.m[1][3] = aFStack_220[1];
        local_138.mInv.m[2][0] = aFStack_218[0];
        local_138.mInv.m[2][1] = aFStack_218[1];
        local_138.mInv.m[2][2] = aFStack_210[0];
        local_138.mInv.m[2][3] = aFStack_210[1];
        local_138.mInv.m[3][0] = aFStack_208[0];
        local_138.mInv.m[3][1] = aFStack_208[1];
        local_138.mInv.m[3][2] = aFStack_200[0];
        local_138.mInv.m[3][3] = aFStack_200[1];
        pbrt::Transform::operator*(&local_2f8,this_00,&local_138);
        pTVar5 = TransformSet::operator[](&this->curTransform,i_00);
        auVar11._8_4_ = local_2f8.m.m[0][2];
        auVar11._12_4_ = local_2f8.m.m[0][3];
        auVar11._0_4_ = local_2f8.m.m[0][0];
        auVar11._4_4_ = local_2f8.m.m[0][1];
        auVar11[0x10] = local_2f8.m.m[1][0]._0_1_;
        auVar11._17_7_ = local_2f8.m.m[1]._1_7_;
        auVar11._24_4_ = local_2f8.m.m[1][2];
        auVar11._28_4_ = local_2f8.m.m[1][3];
        auVar11._32_4_ = local_2f8.m.m[2][0];
        auVar11._36_4_ = local_2f8.m.m[2][1];
        auVar11._40_4_ = local_2f8.m.m[2][2];
        auVar11._44_4_ = local_2f8.m.m[2][3];
        auVar11._48_4_ = local_2f8.m.m[3][0];
        auVar11._52_4_ = local_2f8.m.m[3][1];
        auVar11._56_4_ = local_2f8.m.m[3][2];
        auVar11._60_4_ = local_2f8.m.m[3][3];
        auVar11 = vmovdqu64_avx512f(auVar11);
        auVar12 = vmovdqu64_avx512f((undefined1  [64])local_2f8.mInv.m);
        auVar11 = vmovdqu64_avx512f(auVar11);
        *(undefined1 (*) [64])(pTVar5->m).m = auVar11;
        auVar11 = vmovdqu64_avx512f(auVar12);
        *(undefined1 (*) [64])(pTVar5->mInv).m = auVar11;
      }
      i_00 = 1;
      bVar3 = false;
    } while (bVar7);
  }
  return;
}

Assistant:

void ParsedScene::ConcatTransform(Float tr[16], FileLoc loc) {
    VERIFY_INITIALIZED("ConcatTransform");
    FOR_ACTIVE_TRANSFORMS(curTransform[i] =
                              curTransform[i] * Transpose(pbrt::Transform(SquareMatrix<4>(
                                                    pstd::MakeSpan(tr, 16))));)
}